

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void stack_enqueue_item(stack *stack,stack_item *item)

{
  _Bool _Var1;
  bool bVar2;
  stack_item *local_20;
  stack_item *curr;
  stack_item *item_local;
  stack *stack_local;
  
  _Var1 = stack_has_item(stack);
  if (_Var1) {
    local_20 = stack->head;
    while( true ) {
      bVar2 = false;
      if (local_20 != (stack_item *)0x0) {
        bVar2 = local_20->next != (stack_item *)0x0;
      }
      if (!bVar2) break;
      local_20 = local_20->next;
    }
    local_20->next = item;
    stack->length = stack->length + 1;
  }
  else {
    stack->head = item;
    stack->length = stack->length + 1;
  }
  return;
}

Assistant:

void stack_enqueue_item(struct stack *stack, struct stack_item *item)
{
        if (!stack_has_item(stack)) {
                stack->head = item;
                ++stack->length;

                return;
        }

        // Need to find last item
        struct stack_item *curr = stack->head;

        while (curr != NULL && curr->next != NULL) {
                curr = curr->next;
        }

        // curr should point to the last item now
        curr->next = item;
        ++stack->length;
}